

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void ins_(PDISASM pMyDisasm)

{
  char *pcVar1;
  REGISTERTYPE *pRVar2;
  Int64 *pIVar3;
  UInt8 UVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  UInt8 UVar10;
  Int32 IVar11;
  
  if ((pMyDisasm->Prefix).RepnePrefix == '\x02') {
    (pMyDisasm->Prefix).RepnePrefix = '\x01';
  }
  if ((pMyDisasm->Prefix).RepPrefix == '\x02') {
    (pMyDisasm->Prefix).RepPrefix = '\x01';
  }
  (pMyDisasm->Instruction).Category = 0x10008;
  pcVar1 = (pMyDisasm->Instruction).Mnemonic;
  if ((pMyDisasm->Reserved_).OperandSize < 0x20) {
    builtin_strncpy(pcVar1,"insw",5);
    IVar11 = 0x10;
  }
  else {
    builtin_strncpy(pcVar1,"insd",5);
    IVar11 = 0x20;
  }
  (pMyDisasm->Operand1).OpType = 0x30000;
  (pMyDisasm->Operand1).OpSize = IVar11;
  (pMyDisasm->Operand1).Memory.BaseRegister = 0x80;
  (pMyDisasm->Operand2).OpType = 0x20000;
  (pMyDisasm->Operand2).Registers.type = 1;
  (pMyDisasm->Operand2).Registers.gpr = 4;
  pRVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
  *(byte *)&pRVar2->type = (byte)pRVar2->type | 0x20;
  pIVar3 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
  *(byte *)pIVar3 = (byte)*pIVar3 | 1;
  UVar4 = EFLAGS_TABLE[0x29].SF_;
  UVar5 = EFLAGS_TABLE[0x29].ZF_;
  UVar6 = EFLAGS_TABLE[0x29].AF_;
  UVar7 = EFLAGS_TABLE[0x29].PF_;
  UVar8 = EFLAGS_TABLE[0x29].CF_;
  UVar9 = EFLAGS_TABLE[0x29].TF_;
  UVar10 = EFLAGS_TABLE[0x29].IF_;
  (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x29].OF_;
  (pMyDisasm->Instruction).Flags.SF_ = UVar4;
  (pMyDisasm->Instruction).Flags.ZF_ = UVar5;
  (pMyDisasm->Instruction).Flags.AF_ = UVar6;
  (pMyDisasm->Instruction).Flags.PF_ = UVar7;
  (pMyDisasm->Instruction).Flags.CF_ = UVar8;
  (pMyDisasm->Instruction).Flags.TF_ = UVar9;
  (pMyDisasm->Instruction).Flags.IF_ = UVar10;
  UVar4 = EFLAGS_TABLE[0x29].NT_;
  UVar5 = EFLAGS_TABLE[0x29].RF_;
  UVar6 = EFLAGS_TABLE[0x29].alignment;
  (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x29].DF_;
  (pMyDisasm->Instruction).Flags.NT_ = UVar4;
  (pMyDisasm->Instruction).Flags.RF_ = UVar5;
  (pMyDisasm->Instruction).Flags.alignment = UVar6;
  (pMyDisasm->Operand2).OpSize = 0x10;
  (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
  return;
}

Assistant:

void __bea_callspec__ ins_(PDISASM pMyDisasm)
{
    if (pMyDisasm->Prefix.RepnePrefix == SuperfluousPrefix) {
        pMyDisasm->Prefix.RepnePrefix = InUsePrefix;
    }
    if (pMyDisasm->Prefix.RepPrefix == SuperfluousPrefix) {
        pMyDisasm->Prefix.RepPrefix = InUsePrefix;
    }
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+InOutINSTRUCTION;
    if (GV.OperandSize >= 32) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "insd");
        #endif
        pMyDisasm->Operand1.OpType = MEMORY_TYPE;
        pMyDisasm->Operand1.OpSize = 32;
        pMyDisasm->Operand1.Memory.BaseRegister = REG7;
        pMyDisasm->Operand2.OpType = REGISTER_TYPE;
        pMyDisasm->Operand2.Registers.type = GENERAL_REG;
        pMyDisasm->Operand2.Registers.gpr = REG2;
        pMyDisasm->Operand2.OpSize = 16;
        GV.EIP_++;
        FillFlags(pMyDisasm, 41);
    }
    else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "insw");
        #endif
        pMyDisasm->Operand1.OpType = MEMORY_TYPE;
        pMyDisasm->Operand1.OpSize = 16;
        pMyDisasm->Operand1.Memory.BaseRegister = REG7;
        pMyDisasm->Operand2.OpType = REGISTER_TYPE;
        pMyDisasm->Operand2.Registers.type = GENERAL_REG;
        pMyDisasm->Operand2.Registers.gpr = REG2;
        pMyDisasm->Operand2.OpSize = 16;
        GV.EIP_++;
        FillFlags(pMyDisasm, 41);
    }
}